

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-test.c++
# Opt level: O2

void __thiscall kj::anon_unknown_0::TestCase1162::run(TestCase1162 *this)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  MonotonicClock *pMVar3;
  undefined4 extraout_var_00;
  long *in_R8;
  OwnFd originalDirFd;
  Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_test_c__:1175:3)>
  _kjDefer1175;
  Own<kj::ConnectionReceiver,_std::nullptr_t> listener;
  Own<kj::NetworkAddress,_std::nullptr_t> addr;
  String address;
  AsyncIoContext ioContext;
  OwnFd local_ec;
  Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_test_c__:1175:3)>
  local_e8;
  Own<kj::ConnectionReceiver,_std::nullptr_t> local_d8;
  undefined1 local_c8 [8];
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_c0;
  Own<kj::NetworkAddress,_std::nullptr_t> local_b8;
  char *local_a8;
  char *pcStack_a0;
  undefined8 local_98;
  char *local_90;
  char *pcStack_88;
  undefined8 local_80;
  Array<char> local_78;
  Own<kj::AsyncIoStream,_std::nullptr_t> local_60;
  AsyncIoContext local_50;
  
  setupAsyncIo();
  iVar1 = (*(local_50.provider.ptr)->_vptr_AsyncIoProvider[3])();
  pMVar3 = systemPreciseMonotonicClock();
  iVar2 = (**pMVar3->_vptr_MonotonicClock)(pMVar3);
  local_d8.disposer._0_4_ = getpid();
  local_b8.disposer = (Disposer *)CONCAT44(extraout_var_00,iVar2);
  str<char_const(&)[18],int,long>
            ((String *)&local_78,(kj *)"unix-abstract:foo",(char (*) [18])&local_d8,(int *)&local_b8
             ,in_R8);
  if (local_78.size_ == 0) {
    local_78.ptr = "";
  }
  (*(code *)**(undefined8 **)CONCAT44(extraout_var,iVar1))
            (&local_d8,(undefined8 *)CONCAT44(extraout_var,iVar1),local_78.ptr,
             local_78.size_ + (local_78.size_ == 0),0);
  local_90 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
  ;
  pcStack_88 = "run";
  local_80 = 0x1e00000490;
  Promise<kj::Own<kj::NetworkAddress,_std::nullptr_t>_>::wait
            ((Promise<kj::Own<kj::NetworkAddress,_std::nullptr_t>_> *)&local_b8,&local_d8);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_d8);
  (*(local_b8.ptr)->_vptr_NetworkAddress[2])(&local_d8);
  do {
    local_ec.fd = open(".",0x90000);
    if (-1 < local_ec.fd) goto LAB_001f84dd;
    iVar1 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 != 0) {
    kj::_::Debug::Fault::Fault
              ((Fault *)&local_e8,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
               ,0x495,iVar1,"_kj_fd = open(\".\", 00 | 0200000 | 02000000)","");
    kj::_::Debug::Fault::fatal((Fault *)&local_e8);
  }
LAB_001f84dd:
  do {
    iVar1 = chdir("/");
    if (-1 < iVar1) goto LAB_001f84fd;
    iVar1 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 != 0) {
    kj::_::Debug::Fault::Fault
              ((Fault *)&local_e8,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
               ,0x496,iVar1,"chdir(\"/\")","");
    kj::_::Debug::Fault::fatal((Fault *)&local_e8);
  }
LAB_001f84fd:
  local_e8.maybeFunc.ptr.isSet = true;
  local_e8.maybeFunc.ptr.field_1 =
       (anon_union_8_1_a8c68091_for_NullableValue<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_test_c__:1175:3)>_2
        )&local_ec;
  (**(local_b8.ptr)->_vptr_NetworkAddress)(local_c8);
  Promise<kj::Own<kj::AsyncIoStream,decltype(nullptr)>>::
  attach<kj::Own<kj::ConnectionReceiver,decltype(nullptr)>>
            ((Promise<kj::Own<kj::AsyncIoStream,decltype(nullptr)>> *)&local_c0,
             (Own<kj::ConnectionReceiver,_std::nullptr_t> *)local_c8);
  local_a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
  ;
  pcStack_a0 = "run";
  local_98 = 0x300000499;
  Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_>::wait
            ((Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_> *)&local_60,&local_c0);
  Own<kj::AsyncIoStream,_std::nullptr_t>::dispose(&local_60);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_c0);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)local_c8);
  kj::_::
  Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++:1175:3)>
  ::~Deferred(&local_e8);
  OwnFd::~OwnFd(&local_ec);
  Own<kj::ConnectionReceiver,_std::nullptr_t>::dispose(&local_d8);
  Own<kj::NetworkAddress,_std::nullptr_t>::dispose(&local_b8);
  Array<char>::~Array(&local_78);
  AsyncIoContext::~AsyncIoContext(&local_50);
  return;
}

Assistant:

TEST(AsyncIo, AbstractUnixSocket) {
  auto ioContext = setupAsyncIo();
  auto& network = ioContext.provider->getNetwork();
  auto elapsedSinceEpoch = systemPreciseMonotonicClock().now() - kj::origin<TimePoint>();
  auto address = kj::str("unix-abstract:foo", getpid(), elapsedSinceEpoch / kj::NANOSECONDS);

  Own<NetworkAddress> addr = network.parseAddress(address).wait(ioContext.waitScope);

  Own<ConnectionReceiver> listener = addr->listen();
  // chdir proves no filesystem dependence. Test fails for regular unix socket
  // but passes for abstract unix socket.
  auto originalDirFd = KJ_SYSCALL_FD(open(".", O_RDONLY | O_DIRECTORY | O_CLOEXEC));
  KJ_SYSCALL(chdir("/"));
  KJ_DEFER(KJ_SYSCALL(fchdir(originalDirFd)));

  addr->connect().attach(kj::mv(listener)).wait(ioContext.waitScope);
}